

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoCube.h
# Opt level: O2

void pzgeom::TPZGeoCube::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  int j;
  long row;
  int i;
  long col;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  TPZFNMatrix<4,_double> phi;
  TPZFNMatrix<12,_double> dphi;
  
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (gradx,3,3);
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (gradx);
  TPZFNMatrix<4,_double>::TPZFNMatrix(&phi,8,1);
  TPZFNMatrix<12,_double>::TPZFNMatrix(&dphi,3,8);
  pztopology::TPZCube::TShape<double>
            (loc,&phi.super_TPZFMatrix<double>,&dphi.super_TPZFMatrix<double>);
  for (col = 0; col != 8; col = col + 1) {
    for (row = 0; row != 3; row = row + 1) {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      pdVar2 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,0,col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(gradx,row,0);
      *pdVar2 = extraout_XMM0_Qa * dVar1 + *pdVar2;
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      pdVar2 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,1,col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(gradx,row,1);
      *pdVar2 = extraout_XMM0_Qa_00 * dVar1 + *pdVar2;
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,row,col);
      pdVar2 = TPZFMatrix<double>::operator()(&dphi.super_TPZFMatrix<double>,2,col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(gradx,row,2);
      *pdVar2 = extraout_XMM0_Qa_01 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<12,_double>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<4,_double>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoCube::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 8){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x8." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        for(int i = 0; i < NNodes; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }